

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O2

size_t __thiscall
booster::aio::buffer_impl<const_char_*>::bytes_count(buffer_impl<const_char_*> *this)

{
  pointer peVar1;
  size_t sVar2;
  size_t *psVar3;
  long lVar4;
  bool bVar5;
  
  sVar2 = (size_t)(uint)this->size_;
  if (sVar2 != 0) {
    if (this->size_ == 1) {
      sVar2 = (this->entry_).size;
    }
    else {
      peVar1 = (this->vec_).
               super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = (long)(this->vec_).
                    super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)peVar1 >> 4;
      psVar3 = &peVar1->size;
      sVar2 = 0;
      while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
        sVar2 = sVar2 + *psVar3;
        psVar3 = psVar3 + 2;
      }
    }
  }
  return sVar2;
}

Assistant:

size_t bytes_count() const
			{
				if(size_ == 0)
					return 0;
				if(size_ == 1)
					return entry_.size;
				size_t n = 0;
				for(size_t i=0;i<vec_.size();i++)
					n+=vec_[i].size;
				return n;
			}